

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_block_statemach(Curl_easy *data,connectdata *conn,_Bool disconnecting)

{
  pop3_conn *pop3c;
  CURLcode result;
  _Bool disconnecting_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pop3c._0_4_ = CURLE_OK;
  while ((conn->proto).pop3c.state != POP3_STOP && (CURLcode)pop3c == CURLE_OK) {
    pop3c._0_4_ = Curl_pp_statemach(data,&(conn->proto).ftpc.pp,true,disconnecting);
  }
  return (CURLcode)pop3c;
}

Assistant:

static CURLcode pop3_block_statemach(struct Curl_easy *data,
                                     struct connectdata *conn,
                                     bool disconnecting)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  while(pop3c->state != POP3_STOP && !result)
    result = Curl_pp_statemach(data, &pop3c->pp, TRUE, disconnecting);

  return result;
}